

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConcurrentQueue.h
# Opt level: O0

bool __thiscall
moodycamel::ConcurrentQueue<CSP_Event,moodycamel::ConcurrentQueueDefaultTraits>::Block::
set_empty<(moodycamel::ConcurrentQueue<CSP_Event,moodycamel::ConcurrentQueueDefaultTraits>::InnerQueueContext)1>
          (Block *this,index_t i)

{
  undefined8 in_RSI;
  atomic<bool> *in_RDI;
  
  std::atomic<bool>::store(in_RDI,SUB81((ulong)in_RSI >> 0x38,0),(memory_order)in_RSI);
  return false;
}

Assistant:

inline bool set_empty(index_t i)
        {
            if (context == explicit_context && BLOCK_SIZE <= EXPLICIT_BLOCK_EMPTY_COUNTER_THRESHOLD) {
                // Set flag
                assert(!emptyFlags[BLOCK_SIZE - 1 - static_cast<size_t>(i & static_cast<index_t>(BLOCK_SIZE - 1))].load(std::memory_order_relaxed));
                emptyFlags[BLOCK_SIZE - 1 - static_cast<size_t>(i & static_cast<index_t>(BLOCK_SIZE - 1))].store(true, std::memory_order_release);
                return false;
            }
            else {
                // Increment counter
                auto prevVal = elementsCompletelyDequeued.fetch_add(1, std::memory_order_release);
                assert(prevVal < BLOCK_SIZE);
                return prevVal == BLOCK_SIZE - 1;
            }
        }